

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::~XmlWriter(XmlWriter *this)

{
  bool bVar1;
  XmlWriter *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  XmlFormatting in_stack_0000001c;
  XmlWriter *in_stack_00000020;
  
  while( true ) {
    bVar1 = clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(unaff_retaddr);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    operator|(Newline,Indent);
    endElement(in_stack_00000020,in_stack_0000001c);
  }
  newlineIfNecessary(in_RDI);
  std::__cxx11::string::~string((string *)&in_RDI->m_indent);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

XmlWriter::~XmlWriter() {
        while (!m_tags.empty()) {
            endElement();
        }
        newlineIfNecessary();
    }